

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_cluster_init(void)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  uint local_14;
  char *pcStack_10;
  uint32_t tmp_folder_len;
  char *tmp_folder;
  
  fio_cluster_data_cleanup(0);
  pcStack_10 = getenv("TMPDIR");
  if (pcStack_10 != (char *)0x0) {
    sVar3 = strlen(pcStack_10);
    local_14 = (uint)sVar3;
    if (local_14 < 0xe4) goto LAB_00160f10;
  }
  pcStack_10 = "/tmp";
  sVar3 = strlen("/tmp");
  local_14 = (uint)sVar3;
LAB_00160f10:
  if (0xe2 < local_14) {
    local_14 = 0;
  }
  if ((local_14 != 0) &&
     (memcpy(cluster_data.name,pcStack_10,(ulong)local_14), cluster_data.name[local_14 - 1] != '/'))
  {
    cluster_data.name[local_14] = '/';
    local_14 = local_14 + 1;
  }
  uVar4 = (ulong)local_14;
  builtin_strncpy(cluster_data.name + uVar4,"facil-io",8);
  builtin_strncpy(cluster_data.name + uVar4 + 8,"-soc",4);
  (cluster_data.name + uVar4 + 0xc)[0] = 'k';
  (cluster_data.name + uVar4 + 0xc)[1] = '-';
  local_14 = local_14 + 0xe;
  uVar1 = getpid();
  iVar2 = snprintf(cluster_data.name + local_14,(ulong)(0xff - local_14),"%d",(ulong)uVar1);
  cluster_data.name[iVar2 + local_14] = '\0';
  unlink(cluster_data.name);
  fio_state_callback_add(FIO_CALL_AT_EXIT,fio_cluster_cleanup,(void *)0x0);
  return;
}

Assistant:

static void fio_cluster_init(void) {
  fio_cluster_data_cleanup(0);
  /* create a unique socket name */
  char *tmp_folder = getenv("TMPDIR");
  uint32_t tmp_folder_len = 0;
  if (!tmp_folder || ((tmp_folder_len = (uint32_t)strlen(tmp_folder)) >
                      (FIO_CLUSTER_NAME_LIMIT - 28))) {
#ifdef P_tmpdir
    tmp_folder = (char *)P_tmpdir;
    if (tmp_folder)
      tmp_folder_len = (uint32_t)strlen(tmp_folder);
#else
    tmp_folder = "/tmp/";
    tmp_folder_len = 5;
#endif
  }
  if (tmp_folder_len >= (FIO_CLUSTER_NAME_LIMIT - 28)) {
    tmp_folder_len = 0;
  }
  if (tmp_folder_len) {
    memcpy(cluster_data.name, tmp_folder, tmp_folder_len);
    if (cluster_data.name[tmp_folder_len - 1] != '/')
      cluster_data.name[tmp_folder_len++] = '/';
  }
  memcpy(cluster_data.name + tmp_folder_len, "facil-io-sock-", 14);
  tmp_folder_len += 14;
  tmp_folder_len +=
      snprintf(cluster_data.name + tmp_folder_len,
               FIO_CLUSTER_NAME_LIMIT - tmp_folder_len, "%d", (int)getpid());
  cluster_data.name[tmp_folder_len] = 0;

  /* remove if existing */
  unlink(cluster_data.name);
  /* add cleanup callback */
  fio_state_callback_add(FIO_CALL_AT_EXIT, fio_cluster_cleanup, NULL);
}